

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int HUF_validateCTable(HUF_CElt *CTable,uint *count,uint maxSymbolValue)

{
  bool bVar1;
  ulong uVar2;
  
  if (-1 < (int)maxSymbolValue) {
    uVar2 = 0;
    bVar1 = false;
    do {
      bVar1 = (bool)(bVar1 | ((char)CTable[uVar2 + 1] == '\0' && count[uVar2] != 0));
      uVar2 = uVar2 + 1;
    } while (maxSymbolValue + 1 != uVar2);
    return (int)!bVar1;
  }
  return 1;
}

Assistant:

int HUF_validateCTable(const HUF_CElt* CTable, const unsigned* count, unsigned maxSymbolValue) {
  HUF_CElt const* ct = CTable + 1;
  int bad = 0;
  int s;
  for (s = 0; s <= (int)maxSymbolValue; ++s) {
    bad |= (count[s] != 0) & (HUF_getNbBits(ct[s]) == 0);
  }
  return !bad;
}